

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O0

void __thiscall
embree::Instantiator::Instantiator
          (Instantiator *this,Ref<embree::HeightField> *heightField,
          Ref<embree::SceneGraph::Node> *object,Ref<embree::Image> *distribution,float minDistance,
          size_t N)

{
  undefined8 uVar1;
  undefined8 uVar2;
  vector<float,_std::allocator<float>_> *this_00;
  reference pvVar3;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  size_t x;
  size_t y;
  vector<float,_std::allocator<float>_> values;
  size_t height;
  size_t width;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  RefCount *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe70;
  float in_stack_fffffffffffffe74;
  size_type in_stack_fffffffffffffe78;
  unsigned_long *__args_2;
  unsigned_long *__args_1;
  float **__args;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  ulong local_f8;
  ulong local_f0;
  undefined1 local_e1 [25];
  unsigned_long local_c8;
  ulong local_c0;
  undefined8 local_a8;
  long *local_98;
  long *local_90;
  long *local_88;
  long *local_68;
  long *local_60;
  long *local_58;
  long *local_50;
  long *local_48;
  long *local_40;
  long *local_38;
  undefined8 *local_30;
  undefined8 *local_28;
  undefined8 *local_20;
  float local_18;
  float local_14;
  undefined4 local_10;
  float local_c;
  float local_8;
  undefined4 local_4;
  
  local_a8 = in_R8;
  local_98 = in_RCX;
  local_90 = in_RDX;
  local_88 = in_RSI;
  RefCount::RefCount(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
  *in_RDI = &PTR__Instantiator_00441da8;
  local_50 = in_RDI + 2;
  local_58 = local_88;
  *local_50 = *local_88;
  if (*local_50 != 0) {
    (**(code **)(*(long *)*local_50 + 0x10))();
  }
  local_60 = in_RDI + 3;
  local_68 = local_90;
  *local_60 = *local_90;
  if (*local_60 != 0) {
    (**(code **)(*(long *)*local_60 + 0x10))();
  }
  __args = (float **)(in_RDI + 4);
  std::shared_ptr<embree::Distribution2D>::shared_ptr
            ((shared_ptr<embree::Distribution2D> *)0x11daa9);
  in_RDI[6] = local_a8;
  local_38 = local_98;
  local_c0 = *(ulong *)(*local_98 + 0x10);
  local_40 = local_98;
  __args_1 = (unsigned_long *)*local_98;
  local_c8 = __args_1[3];
  this_00 = (vector<float,_std::allocator<float>_> *)(local_c0 * local_c8);
  __args_2 = (unsigned_long *)local_e1;
  std::allocator<float>::allocator((allocator<float> *)0x11db47);
  std::vector<float,_std::allocator<float>_>::vector
            (this_00,in_stack_fffffffffffffe78,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  std::allocator<float>::~allocator((allocator<float> *)0x11db6d);
  for (local_f0 = 0; local_f0 < local_c8; local_f0 = local_f0 + 1) {
    for (local_f8 = 0; local_f8 < local_c0; local_f8 = local_f8 + 1) {
      local_48 = local_98;
      (**(code **)(*(long *)*local_98 + 0x20))(&local_118,(long *)*local_98,local_f8,local_f0);
      local_20 = &local_108;
      local_28 = &local_118;
      local_108 = local_118;
      uVar1 = local_108;
      uStack_100 = uStack_110;
      uVar2 = uStack_100;
      local_30 = &local_108;
      local_108._0_4_ = (float)local_118;
      local_14 = (float)local_108;
      local_108._4_4_ = (float)((ulong)local_118 >> 0x20);
      local_8 = local_108._4_4_;
      uStack_100._0_4_ = (float)uStack_110;
      local_c = (float)uStack_100 * 0.072169;
      local_4 = 0x3f3714ba;
      local_18 = local_108._4_4_ * 0.71516 + local_c;
      local_10 = 0x3e59c66d;
      in_stack_fffffffffffffe74 = (float)local_108 * 0.212671 + local_18;
      local_108 = uVar1;
      uStack_100 = uVar2;
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(local_e1 + 1),
                          local_f0 * local_c0 + local_f8);
      *pvVar3 = in_stack_fffffffffffffe74;
    }
  }
  std::vector<float,_std::allocator<float>_>::data
            ((vector<float,_std::allocator<float>_> *)0x11ddee);
  std::make_shared<embree::Distribution2D,float*,unsigned_long&,unsigned_long&>
            (__args,__args_1,__args_2);
  std::shared_ptr<embree::Distribution2D>::operator=
            ((shared_ptr<embree::Distribution2D> *)in_stack_fffffffffffffe60,
             (shared_ptr<embree::Distribution2D> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  std::shared_ptr<embree::Distribution2D>::~shared_ptr
            ((shared_ptr<embree::Distribution2D> *)0x11de3a);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  return;
}

Assistant:

Instantiator(const Ref<HeightField>& heightField,
                 const Ref<SceneGraph::Node>& object, const Ref<Image>& distribution, float minDistance, size_t N)
      : heightField(heightField), object(object), /*minDistance(minDistance),*/ N(N)
    {
      /* create distribution */
      size_t width = distribution->width;
      size_t height = distribution->height;
      std::vector<float> values(width*height);
      for (size_t y=0; y<height; y++)
        for (size_t x=0; x<width; x++)
          values[y*width+x] = luminance(distribution->get(x,y));
      dist = std::make_shared<Distribution2D>(values.data(),width,height);
    }